

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

vector<Tle,_std::allocator<Tle>_> *
readTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,string *fname,FILE *fp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  vector<Tle,_std::allocator<Tle>_> *extraout_RAX;
  vector<Tle,_std::allocator<Tle>_> *pvVar5;
  string name;
  string line1;
  string line2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  string *local_80;
  vector<Tle,std::allocator<Tle>> *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0._8_8_ = 0;
  local_a0[0x10] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_80 = fname;
  local_78 = (vector<Tle,std::allocator<Tle>> *)__return_storage_ptr__;
  do {
    local_e0._M_string_length = 0;
    bVar1 = readLine(fp,(string *)local_a0);
    if (!bVar1) {
LAB_00109326:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      pvVar5 = (vector<Tle,_std::allocator<Tle>_> *)(local_a0 + 0x10);
      if ((vector<Tle,_std::allocator<Tle>_> *)local_a0._0_8_ != pvVar5) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        pvVar5 = extraout_RAX;
      }
      return pvVar5;
    }
    iVar2 = isalpha((int)*(char *)local_a0._0_8_);
    if ((iVar2 != 0) || ((ulong)local_a0._8_8_ < 0x19)) {
      std::__cxx11::string::_M_assign((string *)&local_e0);
    }
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_e0,0x11576d,0xffffffffffffffff);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_e0);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if (0x16 < local_e0._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_e0);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = readLine(fp,(string *)local_a0);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unexpected error reading TLE line 1 at line ",0x2c);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_80->_M_dataplus)._M_p,local_80->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_00109313:
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      goto LAB_00109326;
    }
    bVar1 = readLine(fp,&local_70);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unexpected error reading TLE line 2 at line ",0x2c);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_80->_M_dataplus)._M_p,local_80->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      goto LAB_00109313;
    }
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)local_a0);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    std::vector<Tle,std::allocator<Tle>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string>
              (local_78,&local_e0,&local_c0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    *local_e0._M_dataplus._M_p = '\0';
  } while( true );
}

Assistant:

static std::vector<Tle> readTLEs(const std::string &fname, FILE *fp) {
  std::vector<Tle> tles;
  std::string line1, line2, name;
  size_t lineNo = 0;

  while (readLine(fp, line1)) {
    ++lineNo;
    if (std::isalpha(line1[0]) || line1.size() <= 24)
      name = line1;
    // Trim trailing whitespace from name.
    auto en = name.find_last_not_of(" \t\r\n");
    if (en != std::string::npos)
      name = name.substr(0, en + 1);
    // Celestrak and wikipedia say that names are 24 bytes, libsgp4 says 22.
    if (name.size() > 22)
      name = name.substr(0, 22);
    ++lineNo;
    if (!readLine(fp, line1)) {
      std::cerr << "Unexpected error reading TLE line 1 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }
    ++lineNo;
    if (!readLine(fp, line2)) {
      std::cerr << "Unexpected error reading TLE line 2 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }

    tles.emplace_back(name, line1.substr(0, 69), line2.substr(0, 69));
    name.clear();
  }

  return tles;
}